

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::directory(Fl_File_Chooser *this,char *d)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar3 = ".";
  if (d != (char *)0x0) {
    pcVar3 = d;
  }
  cVar1 = *pcVar3;
  if (cVar1 == '\0') {
    this->directory_[0] = '\0';
    goto LAB_001ffc6d;
  }
  if ((cVar1 == '/') || (cVar1 == '\\')) {
    fl_strlcpy(this->directory_,pcVar3,0x800);
  }
  else {
    fl_filename_absolute(this->directory_,0x800,pcVar3);
  }
  pcVar3 = this->directory_;
  sVar4 = strlen(pcVar3);
  pcVar5 = this->directory_ + (sVar4 - 1);
  if (*pcVar5 == '/') {
    if (pcVar3 < pcVar5) {
LAB_001ffbe2:
      *pcVar5 = '\0';
    }
  }
  else if (1 < (long)sVar4 && *pcVar5 == '\\') goto LAB_001ffbe2;
  sVar4 = strlen(pcVar3);
  if (2 < (long)sVar4) {
    pcVar5 = this->directory_ + (sVar4 - 3);
    iVar2 = strcmp(pcVar5,"/..");
    if (iVar2 == 0) {
      *pcVar5 = '\0';
      if (pcVar3 < pcVar5) {
        pcVar6 = this->directory_ + (sVar4 - 4);
        do {
          pcVar5 = pcVar6;
          pcVar6 = pcVar3;
          if (pcVar5 <= pcVar3) goto LAB_001ffc63;
          pcVar6 = pcVar5 + -1;
        } while (*pcVar5 != '/');
      }
      pcVar6 = pcVar5;
      if (pcVar3 <= pcVar5) {
LAB_001ffc63:
        if (*pcVar6 == '/') {
          *pcVar6 = '\0';
        }
      }
      goto LAB_001ffc6d;
    }
  }
  pcVar5 = this->directory_ + (sVar4 - 2);
  if ((((pcVar3 <= pcVar5) && (*pcVar5 == '/')) && (this->directory_[sVar4 - 1] == '.')) &&
     (this->directory_[sVar4] == '\0')) {
    *pcVar5 = '\0';
  }
LAB_001ffc6d:
  iVar2 = shown(this);
  if (iVar2 == 0) {
    return;
  }
  rescan(this);
  return;
}

Assistant:

void
Fl_File_Chooser::directory(const char *d)// I - Directory to change to
{
  char	*dirptr;			// Pointer into directory


//  printf("Fl_File_Chooser::directory(\"%s\")\n", d == NULL ? "(null)" : d);

  // NULL == current directory
  if (d == NULL)
    d = ".";

#ifdef WIN32
  // See if the filename contains backslashes...
  char	*slash;				// Pointer to slashes
  char	fixpath[FL_PATH_MAX];			// Path with slashes converted
  if (strchr(d, '\\')) {
    // Convert backslashes to slashes...
    strlcpy(fixpath, d, sizeof(fixpath));

    for (slash = strchr(fixpath, '\\'); slash; slash = strchr(slash + 1, '\\'))
      *slash = '/';

    d = fixpath;
  }
#endif // WIN32

  if (d[0] != '\0')
  {
    // Make the directory absolute...
#if (defined(WIN32) && ! defined(__CYGWIN__))|| defined(__EMX__)
    if (d[0] != '/' && d[0] != '\\' && d[1] != ':')
#else
    if (d[0] != '/' && d[0] != '\\')
#endif /* WIN32 || __EMX__ */
      fl_filename_absolute(directory_, d);
    else
      strlcpy(directory_, d, sizeof(directory_));

    // Strip any trailing slash...
    dirptr = directory_ + strlen(directory_) - 1;
    if ((*dirptr == '/' || *dirptr == '\\') && dirptr > directory_)
      *dirptr = '\0';

    // See if we have a trailing .. or . in the filename...
    dirptr = directory_ + strlen(directory_) - 3;
    if (dirptr >= directory_ && strcmp(dirptr, "/..") == 0) {
      // Yes, we have "..", so strip the trailing path...
      *dirptr = '\0';
      while (dirptr > directory_) {
        if (*dirptr == '/') break;
	dirptr --;
      }

      if (dirptr >= directory_ && *dirptr == '/')
        *dirptr = '\0';
    } else if ((dirptr + 1) >= directory_ && strcmp(dirptr + 1, "/.") == 0) {
      // Strip trailing "."...
      dirptr[1] = '\0';
    }
  }
  else
    directory_[0] = '\0';

  if (shown()) {
    // Rescan the directory...
    rescan();
  }
}